

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

int __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
::size(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>
       *this)

{
  int iVar1;
  int iVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4
  ;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar5;
  int iVar6;
  int iVar7;
  
  pFVar3 = (this->left_->fadexpr_).right_;
  iVar1 = (((((this->left_->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  pFVar4 = (pFVar3->fadexpr_).left_;
  iVar6 = (((((pFVar4->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar2 < iVar6) {
    iVar2 = iVar6;
  }
  pFVar5 = (pFVar3->fadexpr_).right_;
  iVar6 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  iVar7 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if (iVar7 < iVar6) {
    iVar7 = iVar6;
  }
  if (iVar7 < iVar2) {
    iVar7 = iVar2;
  }
  if (iVar7 < iVar1) {
    iVar7 = iVar1;
  }
  pFVar4 = (this->right_->fadexpr_).left_;
  iVar1 = (((((pFVar4->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  iVar6 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((this->right_->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar1) {
    iVar6 = iVar1;
  }
  if (iVar6 < iVar7) {
    iVar6 = iVar7;
  }
  return iVar6;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }